

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

SVInt __thiscall slang::SVInt::xnor(SVInt *this,SVInt *rhs)

{
  bool bVar1;
  uint32_t uVar2;
  byte bVar3;
  SVInt *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar4;
  SVInt *in_RSI;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 in_RDI;
  SVInt SVar5;
  uint32_t i_2;
  uint32_t i_1;
  uint32_t i;
  uint32_t words;
  bool bothSigned;
  SVInt *result;
  undefined5 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5d;
  undefined1 in_stack_ffffffffffffff5e;
  undefined1 in_stack_ffffffffffffff5f;
  undefined4 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff64;
  undefined1 in_stack_ffffffffffffff65;
  undefined1 in_stack_ffffffffffffff66;
  undefined1 in_stack_ffffffffffffff67;
  SVInt *in_stack_ffffffffffffff70;
  SVInt *this_00;
  undefined7 in_stack_ffffffffffffff78;
  byte bVar6;
  uint local_64;
  uint local_60;
  uint local_5c;
  SVInt local_30;
  undefined7 in_stack_ffffffffffffffe0;
  
  if ((in_RSI->super_SVIntStorage).bitWidth == (in_RDX->super_SVIntStorage).bitWidth) {
    SVInt((SVInt *)CONCAT17(in_stack_ffffffffffffff67,
                            CONCAT16(in_stack_ffffffffffffff66,
                                     CONCAT15(in_stack_ffffffffffffff65,
                                              CONCAT14(in_stack_ffffffffffffff64,
                                                       in_stack_ffffffffffffff60)))),
          (SVInt *)CONCAT17(in_stack_ffffffffffffff5f,
                            CONCAT16(in_stack_ffffffffffffff5e,
                                     CONCAT15(in_stack_ffffffffffffff5d,in_stack_ffffffffffffff58)))
         );
    bVar1 = hasUnknown(in_RSI);
    if ((!bVar1) && (bVar1 = hasUnknown(in_RDX), bVar1)) {
      makeUnknown(in_RSI);
    }
    bVar1 = isSingleWord((SVInt *)in_RDI.pVal);
    if (bVar1) {
      *in_RDI.pVal = *in_RDI.pVal ^ (in_RDX->super_SVIntStorage).field_0.val ^ 0xffffffffffffffff;
    }
    else {
      uVar2 = getNumWords((in_RSI->super_SVIntStorage).bitWidth,false);
      bVar1 = hasUnknown((SVInt *)in_RDI.pVal);
      if (bVar1) {
        bVar1 = isSingleWord(in_RDX);
        if (bVar1) {
          *(ulong *)*in_RDI.pVal =
               (*(ulong *)(*in_RDI.pVal + 8) ^ 0xffffffffffffffff) &
               (*(ulong *)*in_RDI.pVal ^ (in_RDX->super_SVIntStorage).field_0.val ^
               0xffffffffffffffff);
        }
        else {
          bVar1 = hasUnknown(in_RDX);
          if (bVar1) {
            for (local_5c = 0; local_5c < uVar2; local_5c = local_5c + 1) {
              *(uint64_t *)(*in_RDI.pVal + (ulong)(local_5c + uVar2) * 8) =
                   (in_RDX->super_SVIntStorage).field_0.pVal[local_5c + uVar2] |
                   *(ulong *)(*in_RDI.pVal + (ulong)(local_5c + uVar2) * 8);
            }
          }
          for (local_60 = 0; local_60 < uVar2; local_60 = local_60 + 1) {
            *(ulong *)(*in_RDI.pVal + (ulong)local_60 * 8) =
                 (*(ulong *)(*in_RDI.pVal + (ulong)(local_60 + uVar2) * 8) ^ 0xffffffffffffffff) &
                 (*(ulong *)(*in_RDI.pVal + (ulong)local_60 * 8) ^
                  (in_RDX->super_SVIntStorage).field_0.pVal[local_60] ^ 0xffffffffffffffff);
          }
        }
      }
      else {
        for (local_64 = 0; local_64 < uVar2; local_64 = local_64 + 1) {
          *(ulong *)(*in_RDI.pVal + (ulong)local_64 * 8) =
               *(ulong *)(*in_RDI.pVal + (ulong)local_64 * 8) ^
               (in_RDX->super_SVIntStorage).field_0.pVal[local_64] ^ 0xffffffffffffffff;
        }
      }
    }
    clearUnusedBits(in_RSI);
    uVar4 = extraout_RDX_01;
  }
  else {
    bVar6 = 0;
    if (((in_RSI->super_SVIntStorage).signFlag & 1U) != 0) {
      bVar6 = (in_RDX->super_SVIntStorage).signFlag;
    }
    bVar3 = bVar6 & 1;
    if ((in_RSI->super_SVIntStorage).bitWidth < (in_RDX->super_SVIntStorage).bitWidth) {
      this_00 = &local_30;
      extend((SVInt *)CONCAT17(bVar6,in_stack_ffffffffffffff78),(bitwidth_t)((ulong)this_00 >> 0x20)
             ,SUB81((ulong)this_00 >> 0x18,0));
      xnor(in_RDX,(SVInt *)CONCAT17(bVar3,in_stack_ffffffffffffffe0));
      ~SVInt(this_00);
      uVar4 = extraout_RDX;
    }
    else {
      extend((SVInt *)CONCAT17(bVar6,in_stack_ffffffffffffff78),
             (bitwidth_t)((ulong)in_stack_ffffffffffffff70 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffff70 >> 0x18,0));
      xnor(in_RDX,(SVInt *)CONCAT17(bVar3,in_stack_ffffffffffffffe0));
      ~SVInt(in_stack_ffffffffffffff70);
      uVar4 = extraout_RDX_00;
    }
  }
  SVar5.super_SVIntStorage.bitWidth = (int)uVar4;
  SVar5.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar4 >> 0x20);
  SVar5.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar4 >> 0x28);
  SVar5.super_SVIntStorage._14_2_ = (short)((ulong)uVar4 >> 0x30);
  SVar5.super_SVIntStorage.field_0.val = in_RDI.val;
  return (SVInt)SVar5.super_SVIntStorage;
}

Assistant:

SVInt SVInt::xnor(const SVInt& rhs) const {
    if (bitWidth != rhs.bitWidth) {
        bool bothSigned = signFlag && rhs.signFlag;
        if (bitWidth < rhs.bitWidth)
            return extend(rhs.bitWidth, bothSigned).xnor(rhs);
        else
            return xnor(rhs.extend(bitWidth, bothSigned));
    }

    SVInt result(*this);
    if (!hasUnknown() && rhs.hasUnknown())
        result.makeUnknown();

    if (result.isSingleWord())
        result.val = ~(result.val ^ rhs.val);
    else {
        uint32_t words = getNumWords(bitWidth, false);
        if (result.hasUnknown()) {
            if (rhs.isSingleWord())
                result.pVal[0] = ~result.pVal[1] & ~(result.pVal[0] ^ rhs.val);
            else {
                if (rhs.hasUnknown()) {
                    for (uint32_t i = 0; i < words; i++)
                        result.pVal[i + words] |= rhs.pVal[i + words];
                }

                for (uint32_t i = 0; i < words; i++)
                    result.pVal[i] = ~result.pVal[i + words] & ~(result.pVal[i] ^ rhs.pVal[i]);
            }
        }
        else {
            for (uint32_t i = 0; i < words; i++)
                result.pVal[i] = ~(result.pVal[i] ^ rhs.pVal[i]);
        }
    }
    result.clearUnusedBits();
    return result;
}